

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelFillsElement::~IfcRelFillsElement(IfcRelFillsElement *this)

{
  _func_int *p_Var1;
  code *pcVar2;
  _func_int *p_Var3;
  
  p_Var3 = (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper +
           (long)p_Var3);
  pcVar2 = p_Var3 + 0x10 +
           (long)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.Description.ptr.
                  _M_dataplus;
  *(long *)(pcVar2 + -0x70) = 0x82a4c0;
  *(long *)(pcVar2 + 0x58) = 0x82a4e8;
  if (*(code **)(pcVar2 + -0x10) != pcVar2) {
    operator_delete(*(code **)(pcVar2 + -0x10),*(long *)pcVar2 + 1);
  }
  if (*(code **)(p_Var1 + 0x38) != p_Var1 + 0x48) {
    operator_delete(*(code **)(p_Var1 + 0x38),*(long *)(p_Var1 + 0x48) + 1);
  }
  if (*(code **)(p_Var1 + 0x10) != p_Var1 + 0x20) {
    operator_delete(*(code **)(p_Var1 + 0x10),*(long *)(p_Var1 + 0x20) + 1);
  }
  operator_delete(p_Var1,0xe0);
  return;
}

Assistant:

IfcRelFillsElement() : Object("IfcRelFillsElement") {}